

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

UninterpretedOption_NamePart *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
          (Arena *arena)

{
  UninterpretedOption_NamePart *this;
  
  if (arena == (Arena *)0x0) {
    this = (UninterpretedOption_NamePart *)operator_new(0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this);
  }
  else {
    AllocHook(arena,(type_info *)&UninterpretedOption_NamePart::typeinfo,0x28);
    this = (UninterpretedOption_NamePart *)AllocateAlignedNoHook(arena,0x28);
    UninterpretedOption_NamePart::UninterpretedOption_NamePart(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::UninterpretedOption_NamePart >(arena);
}